

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void generate_random_data(uint16_t *data,uint32_t n)

{
  result_type rVar1;
  uint uVar2;
  ulong uVar3;
  uniform_int_distribution<unsigned_short> distr;
  random_device rd;
  mt19937 eng;
  param_type local_2744;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::random_device::random_device(&local_2740);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,(ulong)uVar2);
  local_2744._M_a = 0;
  local_2744._M_b = 0xfffe;
  for (uVar3 = 0; n != uVar3; uVar3 = uVar3 + 1) {
    rVar1 = std::uniform_int_distribution<unsigned_short>::operator()
                      ((uniform_int_distribution<unsigned_short> *)&local_2744,&local_13b8);
    data[uVar3] = rVar1;
  }
  std::random_device::~random_device(&local_2740);
  return;
}

Assistant:

void generate_random_data(uint16_t* data, uint32_t n) {
    std::random_device rd; // obtain a random number from hardware
    std::mt19937 eng(rd()); // seed the generator

    std::uniform_int_distribution<uint16_t> distr(0, std::numeric_limits<uint16_t>::max()-1); // right inclusive

    for (int i = 0; i < n; ++i) {
        data[i] = distr(eng);
    }
}